

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::TryGetReference<unsigned_int>
          (BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           *this,uint *key,ValueRelativeOffset **value,int *index)

{
  Type piVar1;
  Type pSVar2;
  uint uVar3;
  ValueNumber VVar4;
  Type this_00;
  uint uVar5;
  
  piVar1 = this->buckets;
  uVar3 = 0;
  if (piVar1 != (Type)0x0) {
    uVar3 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uVar5 = piVar1[uVar3];
    uVar3 = 0;
    if (-1 < (int)uVar5) {
      pSVar2 = this->entries;
      uVar3 = 0;
      do {
        VVar4 = ValueRelativeOffset::BaseValueNumber((ValueRelativeOffset *)(pSVar2 + uVar5));
        if (VVar4 == *key) {
          this_00 = this->stats;
          goto LAB_004b6db3;
        }
        uVar3 = uVar3 + 1;
        uVar5 = *(uint *)&((ValueRelativeOffset *)(pSVar2 + uVar5))[1].baseValue;
      } while (-1 < (int)uVar5);
    }
  }
  this_00 = this->stats;
  uVar5 = 0xffffffff;
LAB_004b6db3:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar3);
  }
  if (-1 < (int)uVar5) {
    *value = (ValueRelativeOffset *)(this->entries + uVar5);
    *index = uVar5;
  }
  return -1 < (int)uVar5;
}

Assistant:

bool TryGetReference(const TLookup& key, const TValue** value, int* index) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = AddressOf(entries[i].Value());
                *index = i;
                return true;
            }
            return false;
        }